

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto.cc
# Opt level: O3

bool __thiscall
absl::log_internal::EncodeBytes
          (log_internal *this,uint64_t tag,Span<const_char> value,Span<char> *buf)

{
  Span<char> *pSVar1;
  anon_unknown_1 *this_00;
  ulong uVar2;
  bool bVar3;
  Span<char> *pSVar4;
  Span<char> *pSVar5;
  Span<char> *pSVar6;
  Span<char> *pSVar7;
  Span<char> *pSVar8;
  Span<char> *pSVar9;
  Span<char> *pSVar10;
  size_type sVar11;
  anon_unknown_1 *paVar12;
  Span<char> *extraout_RDX;
  undefined8 *size;
  uint64_t uVar13;
  pointer __dest;
  undefined1 uVar14;
  uint64_t uVar15;
  ulong uVar16;
  Span<char> *this_01;
  
  pSVar9 = (Span<char> *)value.len_;
  pSVar6 = (Span<char> *)value.ptr_;
  pSVar10 = (Span<char> *)((long)this * 8 + 2);
  uVar15 = 1;
  uVar13 = 1;
  pSVar5 = pSVar10;
  pSVar4 = pSVar9;
  if (0x7f < (ulong)((long)this << 3)) {
    do {
      pSVar4 = (Span<char> *)((ulong)pSVar5 >> 7);
      uVar13 = uVar13 + 1;
      bVar3 = (Span<char> *)0x3fff < pSVar5;
      pSVar5 = pSVar4;
    } while (bVar3);
  }
  if ((Span<char> *)0x7f < pSVar6) {
    uVar15 = 1;
    pSVar5 = pSVar6;
    do {
      pSVar4 = (Span<char> *)((ulong)pSVar5 >> 7);
      uVar15 = uVar15 + 1;
      bVar3 = (Span<char> *)0x3fff < pSVar5;
      pSVar5 = pSVar4;
    } while (bVar3);
  }
  uVar16 = (long)&pSVar6->ptr_ + uVar15 + uVar13;
  uVar2 = pSVar9->len_;
  if (uVar2 < uVar16) {
    pSVar10 = (Span<char> *)0x0;
  }
  else {
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)pSVar10,uVar13,(size_t)pSVar9,pSVar4);
    anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)pSVar6,uVar15,(size_t)pSVar9,pSVar4);
    __dest = pSVar9->ptr_;
    memcpy(__dest,(void *)tag,(size_t)pSVar6);
    pSVar10 = (Span<char> *)((long)pSVar9->len_ - (long)pSVar6);
    if ((Span<char> *)pSVar9->len_ < pSVar6) {
      EncodeBytes();
      pSVar5 = (Span<char> *)((long)__dest * 8 + 2);
      uVar13 = 1;
      pSVar4 = (Span<char> *)0x1;
      pSVar9 = pSVar5;
      pSVar6 = pSVar10;
      if (0x7f < (ulong)((long)__dest << 3)) {
        do {
          pSVar6 = (Span<char> *)((ulong)pSVar9 >> 7);
          pSVar4 = (Span<char> *)((long)&pSVar4->ptr_ + 1);
          bVar3 = (Span<char> *)0x3fff < pSVar9;
          pSVar9 = pSVar6;
        } while (bVar3);
      }
      pSVar9 = (Span<char> *)pSVar10->len_;
      pSVar7 = extraout_RDX;
      if (pSVar9 < extraout_RDX) {
        pSVar7 = pSVar9;
      }
      if ((Span<char> *)0x7f < pSVar7) {
        uVar13 = 1;
        do {
          pSVar6 = (Span<char> *)((ulong)pSVar7 >> 7);
          uVar13 = uVar13 + 1;
          bVar3 = (Span<char> *)0x3fff < pSVar7;
          pSVar7 = pSVar6;
        } while (bVar3);
      }
      pSVar7 = (Span<char> *)((long)&pSVar4->ptr_ + uVar13);
      this_01 = extraout_RDX;
      if (((pSVar7 <= pSVar9) &&
          (pSVar1 = (Span<char> *)((long)&pSVar7->ptr_ + (long)&extraout_RDX->ptr_),
          pSVar8 = (Span<char> *)((long)pSVar1 - (long)pSVar9),
          pSVar9 <= pSVar1 && pSVar8 != (Span<char> *)0x0)) &&
         (this_01 = (Span<char> *)((long)extraout_RDX - (long)pSVar8), extraout_RDX < pSVar8)) {
LAB_0012c5d0:
        EncodeBytesTruncate();
        this_00 = (anon_unknown_1 *)((long)pSVar5 * 8 + 2);
        uVar15 = 1;
        uVar13 = 1;
        paVar12 = this_00;
        if (0x7f < (ulong)((long)pSVar5 << 3)) {
          do {
            uVar13 = uVar13 + 1;
            bVar3 = (anon_unknown_1 *)0x3fff < paVar12;
            paVar12 = (anon_unknown_1 *)((ulong)paVar12 >> 7);
          } while (bVar3);
        }
        pSVar10 = (Span<char> *)size[1];
        if (pSVar10 < pSVar4) {
          pSVar4 = pSVar10;
        }
        if ((Span<char> *)0x7f < pSVar4) {
          uVar15 = 1;
          do {
            uVar15 = uVar15 + 1;
            bVar3 = (Span<char> *)0x3fff < pSVar4;
            pSVar4 = (Span<char> *)((ulong)pSVar4 >> 7);
          } while (bVar3);
        }
        if (pSVar10 < (Span<char> *)(uVar15 + uVar13)) {
          size[1] = 0;
          uVar14 = 0;
        }
        else {
          anon_unknown_1::EncodeRawVarint(this_00,uVar13,(size_t)size,pSVar10);
          uVar14 = (undefined1)*size;
          anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)0x0,uVar15,(size_t)size,pSVar10);
        }
        return (bool)uVar14;
      }
      pSVar7 = (Span<char> *)((long)&this_01->ptr_ + (long)&pSVar7->ptr_);
      if (pSVar9 < pSVar7) {
        sVar11 = 0;
      }
      else {
        anon_unknown_1::EncodeRawVarint
                  ((anon_unknown_1 *)pSVar5,(uint64_t)pSVar4,(size_t)pSVar10,pSVar6);
        anon_unknown_1::EncodeRawVarint((anon_unknown_1 *)this_01,uVar13,(size_t)pSVar10,pSVar6);
        pSVar5 = (Span<char> *)pSVar10->ptr_;
        memcpy(pSVar5,(void *)tag,(size_t)this_01);
        sVar11 = (long)pSVar10->len_ - (long)this_01;
        if ((Span<char> *)pSVar10->len_ < this_01) {
          EncodeBytesTruncate();
          pSVar4 = (Span<char> *)tag;
          goto LAB_0012c5d0;
        }
        pSVar10->ptr_ = (pointer)((long)&this_01->ptr_ + (long)pSVar10->ptr_);
      }
      pSVar10->len_ = sVar11;
      return pSVar7 <= pSVar9;
    }
    pSVar9->ptr_ = (pointer)((long)&pSVar6->ptr_ + (long)pSVar9->ptr_);
  }
  pSVar9->len_ = (size_type)pSVar10;
  return uVar16 <= uVar2;
}

Assistant:

bool EncodeBytes(uint64_t tag, absl::Span<const char> value,
                 absl::Span<char> *buf) {
  const uint64_t tag_type = MakeTagType(tag, WireType::kLengthDelimited);
  const size_t tag_type_size = VarintSize(tag_type);
  uint64_t length = value.size();
  const size_t length_size = VarintSize(length);
  if (tag_type_size + length_size + value.size() > buf->size()) {
    buf->remove_suffix(buf->size());
    return false;
  }
  EncodeRawVarint(tag_type, tag_type_size, buf);
  EncodeRawVarint(length, length_size, buf);
  memcpy(buf->data(), value.data(), value.size());
  buf->remove_prefix(value.size());
  return true;
}